

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,ImS64 *p_scroll_v,
                       ImS64 size_avail_v,ImS64 size_contents_v,ImDrawFlags flags)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [16];
  bool bVar3;
  ImGuiContext *pIVar4;
  ImU32 col;
  ImU32 col_00;
  ImGuiCol idx;
  long lVar5;
  uint uVar6;
  float fVar7;
  int iVar8;
  undefined1 auVar9 [12];
  float fVar14;
  int iVar15;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined4 in_XMM5_Db;
  undefined4 in_XMM5_Dc;
  undefined4 in_XMM5_Dd;
  bool local_ee;
  bool local_ed;
  float local_ec;
  ImRect local_e8;
  ImGuiAxis local_cc;
  long *local_c8;
  ImGuiWindow *local_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImVec2 local_40;
  ImVec2 local_38;
  undefined1 auVar12 [16];
  undefined1 auVar18 [16];
  
  pIVar4 = GImGui;
  local_c0 = GImGui->CurrentWindow;
  if (local_c0->SkipItems == false) {
    fVar7 = (bb_frame->Max).x - (bb_frame->Min).x;
    fVar14 = (bb_frame->Max).y - (bb_frame->Min).y;
    local_ee = false;
    if ((0.0 < fVar7) && (0.0 < fVar14)) {
      local_ec = 1.0;
      if (axis == ImGuiAxis_Y) {
        fVar20 = (GImGui->Style).FramePadding.y;
        fVar20 = fVar20 + fVar20;
        if (fVar14 < fVar20 + GImGui->FontSize) {
          fVar20 = (fVar14 - GImGui->FontSize) / fVar20;
          if (fVar20 < 0.0) {
            return false;
          }
          local_ec = 1.0;
          if (fVar20 <= 1.0) {
            local_ec = fVar20;
          }
          if (local_ec <= 0.0) {
            return false;
          }
        }
      }
      iVar8 = (int)((fVar7 + -2.0) * 0.5);
      iVar15 = (int)((fVar14 + -2.0) * 0.5);
      auVar21._0_4_ = -(uint)(iVar8 < 0);
      auVar21._4_4_ = -(uint)(iVar15 < 0);
      auVar21._8_8_ = 0;
      auVar10._0_4_ = -(uint)(3 < iVar8);
      auVar10._4_4_ = -(uint)(3 < iVar15);
      auVar10._8_8_ = 0;
      auVar22._8_4_ = 0x80000000;
      auVar22._0_8_ = CONCAT44((float)iVar15,(float)iVar8) ^ 0x8000000080000000;
      auVar22._12_4_ = 0x80000000;
      auVar22 = auVar21 & _DAT_00263820 | ~auVar21 & (auVar10 & _DAT_002590a0 | ~auVar10 & auVar22);
      fStack_b0 = auVar22._0_4_;
      fVar14 = auVar22._4_4_;
      auVar16._0_8_ = auVar22._0_8_;
      auVar16._8_4_ = fStack_b0;
      auVar16._12_4_ = fVar14;
      local_e8.Min.x = (bb_frame->Min).x;
      local_e8.Min.y = (bb_frame->Min).y;
      local_e8.Max.x = (bb_frame->Max).x;
      local_e8.Max.y = (bb_frame->Max).y;
      local_b8 = local_e8.Min.x - fStack_b0;
      fVar7 = local_e8.Min.y - fVar14;
      fStack_b0 = local_e8.Max.x + fStack_b0;
      fStack_b4 = local_e8.Max.y + fVar14;
      auVar1._4_8_ = auVar16._8_8_;
      auVar1._0_4_ = local_e8.Min.y + fVar14;
      auVar17._0_8_ = auVar1._0_8_ << 0x20;
      auVar17._8_4_ = fStack_b0;
      auVar17._12_4_ = fStack_b4;
      local_e8.Max = auVar17._8_8_;
      local_e8.Min.y = fVar7;
      local_e8.Min.x = local_b8;
      if (axis != ImGuiAxis_X) {
        fStack_b0 = fStack_b4;
        local_b8 = fVar7;
      }
      local_b8 = fStack_b0 - local_b8;
      lVar5 = size_contents_v - size_avail_v;
      if (lVar5 == 0 || size_contents_v < size_avail_v) {
        size_contents_v = size_avail_v;
      }
      if (size_contents_v < 2) {
        size_contents_v = 1;
      }
      fVar20 = ((float)size_avail_v / (float)size_contents_v) * local_b8;
      fVar7 = (GImGui->Style).GrabMinSize;
      fVar14 = local_b8;
      if (fVar20 <= local_b8) {
        fVar14 = fVar20;
      }
      uVar6 = -(uint)(fVar20 < fVar7);
      local_98 = (float)(uVar6 & (uint)fVar7 | ~uVar6 & (uint)fVar14);
      local_ee = false;
      local_ed = false;
      local_cc = axis;
      local_c8 = p_scroll_v;
      fStack_ac = fStack_b4;
      fStack_94 = fStack_b4;
      fStack_90 = fStack_b0;
      fStack_8c = fStack_b4;
      ItemAdd(bb_frame,id,(ImRect *)0x0,8);
      ButtonBehavior(&local_e8,id,&local_ed,&local_ee,0x40000);
      auVar2._8_4_ = fStack_b0;
      auVar2._0_8_ = CONCAT44(fStack_b4,local_b8);
      auVar2._12_4_ = fStack_ac;
      if (lVar5 < 2) {
        lVar5 = 1;
      }
      auVar23._4_4_ = (float)*local_c8;
      auVar23._0_4_ = local_98;
      auVar23._8_4_ = fStack_94;
      auVar23._12_4_ = 0;
      auVar12._8_4_ = fStack_b4;
      auVar12._0_8_ = CONCAT44(fStack_b4,local_b8);
      auVar12._12_4_ = in_XMM5_Db;
      auVar11._8_8_ = auVar12._8_8_;
      auVar11._4_4_ = (float)lVar5;
      auVar11._0_4_ = local_b8;
      auVar22 = divps(auVar23,auVar11);
      fVar14 = auVar22._4_4_;
      iVar8 = -(uint)(auVar22._0_4_ < 1.0);
      iVar15 = -(uint)(fVar14 < 0.0);
      auVar19._4_4_ = iVar15;
      auVar19._0_4_ = iVar8;
      auVar19._8_4_ = iVar15;
      auVar19._12_4_ = iVar15;
      auVar18._8_8_ = auVar19._8_8_;
      auVar18._4_4_ = iVar8;
      auVar18._0_4_ = iVar8;
      uVar6 = movmskpd((int)local_c8,auVar18);
      fVar7 = 0.0;
      if (((uVar6 & 2) == 0) && (fVar7 = 1.0, fVar14 <= 1.0)) {
        fVar7 = fVar14;
      }
      auVar13._4_12_ = auVar2._4_12_;
      auVar13._0_4_ = local_b8 - local_98;
      local_a8 = (fVar7 * auVar13._0_4_) / local_b8;
      uStack_a4 = 0;
      uStack_a0 = 0;
      uStack_9c = 0;
      if (((1.0 <= local_ec) && ((uVar6 & 1) != 0)) && (local_ee != false)) {
        local_58 = auVar13;
        local_78 = (float)lVar5;
        uStack_74 = in_XMM5_Db;
        uStack_70 = in_XMM5_Dc;
        uStack_6c = in_XMM5_Dd;
        local_68 = auVar22;
        fVar7 = ((pIVar4->IO).NavInputs[(long)local_cc + 0x10] - (&local_e8.Min.x)[local_cc]) /
                local_b8;
        auVar9 = ZEXT812(0x3f800000);
        if (fVar7 <= 1.0) {
          auVar9._4_8_ = 0;
          auVar9._0_4_ = fVar7;
        }
        local_88._4_4_ = 0;
        local_88._0_4_ = ~-(uint)(fVar7 < 0.0) & auVar9._0_4_;
        local_88._8_4_ = auVar9._8_4_;
        local_88._12_4_ = 0;
        SetHoveredID(id);
        if (pIVar4->ActiveIdIsJustActivated == false) {
          fVar7 = pIVar4->ScrollbarClickDeltaToGrabCenter;
          bVar3 = false;
        }
        else if (((float)local_88._0_4_ < local_a8) ||
                ((float)local_68._0_4_ + local_a8 < (float)local_88._0_4_)) {
          pIVar4->ScrollbarClickDeltaToGrabCenter = 0.0;
          bVar3 = true;
          fVar7 = 0.0;
        }
        else {
          fVar7 = (float)local_68._0_4_ * -0.5 + ((float)local_88._0_4_ - local_a8);
          pIVar4->ScrollbarClickDeltaToGrabCenter = fVar7;
          bVar3 = false;
        }
        fVar14 = ((float)local_68._0_4_ * -0.5 + ((float)local_88._0_4_ - fVar7)) /
                 (1.0 - (float)local_68._0_4_);
        fVar7 = 1.0;
        if (fVar14 <= 1.0) {
          fVar7 = fVar14;
        }
        lVar5 = (long)((float)(~-(uint)(fVar14 < 0.0) & (uint)fVar7) * local_78);
        *local_c8 = lVar5;
        fVar14 = (float)lVar5 / local_78;
        fVar7 = 1.0;
        if (fVar14 <= 1.0) {
          fVar7 = fVar14;
        }
        local_a8 = ((float)local_58._0_4_ * (float)(~-(uint)(fVar14 < 0.0) & (uint)fVar7)) /
                   local_b8;
        uStack_a4 = local_58._4_4_;
        uStack_a0 = local_58._8_4_;
        uStack_9c = local_58._12_4_;
        if (bVar3) {
          pIVar4->ScrollbarClickDeltaToGrabCenter =
               -(float)local_68._0_4_ * 0.5 + ((float)local_88._0_4_ - local_a8);
        }
      }
      col = GetColorU32(0xe,1.0);
      idx = 0x11;
      if (local_ee == false) {
        idx = (local_ed & 1) + 0xf;
      }
      col_00 = GetColorU32(idx,local_ec);
      ImDrawList::AddRectFilled
                (local_c0->DrawList,&bb_frame->Min,&bb_frame->Max,col,local_c0->WindowRounding,flags
                );
      if (local_cc == ImGuiAxis_X) {
        local_40.x = local_e8.Min.x + (local_e8.Max.x - local_e8.Min.x) * local_a8;
        local_38.x = local_98 + local_40.x;
        local_38.y = local_e8.Max.y;
        local_40.y = local_e8.Min.y;
      }
      else {
        local_40.y = (local_e8.Max.y - local_e8.Min.y) * local_a8 + local_e8.Min.y;
        local_38.y = local_98 + local_40.y;
        local_38.x = local_e8.Max.x;
        local_40.x = local_e8.Min.x;
      }
      ImDrawList::AddRectFilled
                (local_c0->DrawList,&local_40,&local_38,col_00,(pIVar4->Style).ScrollbarRounding,0);
    }
  }
  else {
    local_ee = false;
  }
  return local_ee;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, ImS64* p_scroll_v, ImS64 size_avail_v, ImS64 size_contents_v, ImDrawFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the window resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp(IM_FLOOR((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp(IM_FLOOR((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = (axis == ImGuiAxis_X) ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const ImS64 win_size_v = ImMax(ImMax(size_contents_v, size_avail_v), (ImS64)1);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * ((float)size_avail_v / (float)win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ItemAdd(bb_frame, id, NULL, ImGuiItemFlags_NoNav);
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    const ImS64 scroll_max = ImMax((ImS64)1, size_contents_v - size_avail_v);
    float scroll_ratio = ImSaturate((float)*p_scroll_v / (float)scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v; // Grab position in normalized space
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        const float scrollbar_pos_v = bb.Min[axis];
        const float mouse_pos_v = g.IO.MousePos[axis];

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            seek_absolute = (clicked_v_norm < grab_v_norm || clicked_v_norm > grab_v_norm + grab_h_norm);
            if (seek_absolute)
                g.ScrollbarClickDeltaToGrabCenter = 0.0f;
            else
                g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
        }

        // Apply scroll (p_scroll_v will generally point on one member of window->Scroll)
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
        *p_scroll_v = (ImS64)(scroll_v_norm * scroll_max);

        // Update values for rendering
        scroll_ratio = ImSaturate((float)*p_scroll_v / (float)scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    const ImU32 bg_col = GetColorU32(ImGuiCol_ScrollbarBg);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, bg_col, window->WindowRounding, flags);
    ImRect grab_rect;
    if (axis == ImGuiAxis_X)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}